

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasMapFields(Descriptor *descriptor)

{
  long lVar1;
  once_flag *__once;
  bool bVar2;
  long lVar3;
  long lVar4;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (0 < *(int *)(descriptor + 4)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x28);
      __once = *(once_flag **)(lVar1 + 0x18 + lVar4);
      if (__once != (once_flag *)0x0) {
        local_38 = FieldDescriptor::TypeOnceInit;
        local_40 = (FieldDescriptor *)(lVar1 + lVar4);
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_38,&local_40);
      }
      if ((*(char *)(lVar1 + 2 + lVar4) == '\v') &&
         (bVar2 = FieldDescriptor::is_map_message_type((FieldDescriptor *)(lVar1 + lVar4)), bVar2))
      {
        return true;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar3 < *(int *)(descriptor + 4));
  }
  if (*(int *)(descriptor + 0x70) < 1) {
    bVar2 = false;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar2 = HasMapFields((Descriptor *)(*(long *)(descriptor + 0x38) + lVar3));
      if (bVar2) {
        return bVar2;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x88;
    } while (lVar4 < *(int *)(descriptor + 0x70));
  }
  return bVar2;
}

Assistant:

static bool HasMapFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->is_map()) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasMapFields(descriptor->nested_type(i))) return true;
  }
  return false;
}